

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BARef::BARef(BARef *this,size_t size)

{
  Box *in_RDI;
  size_type in_stack_ffffffffffffffb8;
  
  std::allocator<amrex::Box>::allocator((allocator<amrex::Box> *)0x1251101);
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI,in_stack_ffffffffffffffb8,
             (allocator_type *)0x1251115);
  std::allocator<amrex::Box>::~allocator((allocator<amrex::Box> *)0x1251121);
  Box::Box(in_RDI);
  IntVect::IntVect((IntVect *)&in_RDI[1].btype);
  std::
  unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::unordered_map((unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)0x125114b);
  *(undefined1 *)(in_RDI[4].smallend.vect + 2) = 0;
  return;
}

Assistant:

BARef::BARef (size_t size)
    : m_abox(size)
{
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(1);
#endif
}